

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS ref_interp_nearest_tet_via_tri_in_tree(REF_INTERP ref_interp,REF_SEARCH ref_search)

{
  uint cell;
  int node;
  int iVar1;
  REF_MPI pRVar2;
  REF_NODE pRVar3;
  REF_CELL pRVar4;
  REF_NODE pRVar5;
  REF_GLOB *pRVar6;
  REF_DBL *pRVar7;
  uint uVar8;
  REF_STATUS RVar9;
  uint uVar10;
  void *pvVar11;
  void *my_array;
  double *pdVar12;
  REF_INT *pRVar13;
  long lVar14;
  long lVar15;
  undefined8 uVar16;
  long lVar17;
  ulong uVar18;
  char *pcVar19;
  REF_INT my_size;
  size_t sVar20;
  double dVar21;
  REF_DBL RVar22;
  uint local_1a0;
  REF_INT total_node;
  ulong local_190;
  REF_MPI local_188;
  REF_INT *local_180;
  double *local_178;
  void *local_170;
  REF_INT *local_168;
  REF_INT nrecv;
  REF_CELL local_158;
  REF_INT *source;
  REF_DBL *global_xyz;
  REF_LIST ref_list;
  void *local_138;
  void *local_130;
  double *local_128;
  REF_INT *local_120;
  void *local_118;
  uint local_10c;
  void *local_108;
  REF_DBL *recv_bary;
  REF_INT *recv_node;
  REF_INT *recv_cell;
  REF_INT *recv_proc;
  REF_INT *global_node;
  void *local_d8;
  REF_NODE local_d0;
  REF_DBL bary [4];
  REF_INT nodes [27];
  
  pRVar2 = ref_interp->ref_mpi;
  pRVar3 = ref_interp->from_grid->node;
  pRVar4 = ref_interp->from_tet;
  pRVar5 = ref_interp->to_grid->node;
  uVar8 = ref_list_create(&ref_list);
  if (uVar8 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x55f,
           "ref_interp_nearest_tet_via_tri_in_tree",(ulong)uVar8,"create list");
    return uVar8;
  }
  if ((long)pRVar5->max < 1) {
    uVar8 = 0;
  }
  else {
    lVar14 = 0;
    uVar8 = 0;
    do {
      if ((-1 < pRVar5->global[lVar14]) && (pRVar5->ref_mpi->id == pRVar5->part[lVar14])) {
        uVar8 = uVar8 + (ref_interp->cell[lVar14] == -1);
      }
      lVar14 = lVar14 + 1;
    } while (pRVar5->max != lVar14);
  }
  local_158 = pRVar4;
  local_d0 = pRVar3;
  if ((int)uVar8 < 0) {
    pcVar19 = "malloc local_node of REF_INT negative";
    uVar16 = 0x567;
LAB_001a2628:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar16
           ,"ref_interp_nearest_tet_via_tri_in_tree",pcVar19);
    RVar9 = 1;
  }
  else {
    local_188 = pRVar2;
    pvVar11 = malloc((ulong)uVar8 << 2);
    if (pvVar11 == (void *)0x0) {
      pcVar19 = "malloc local_node of REF_INT NULL";
      uVar16 = 0x567;
    }
    else {
      my_array = malloc((ulong)(uVar8 * 3) << 3);
      if (my_array == (void *)0x0) {
        pcVar19 = "malloc local_xyz of REF_DBL NULL";
        uVar16 = 0x568;
      }
      else {
        if (pRVar5->max < 1) {
          my_size = 0;
        }
        else {
          pRVar6 = pRVar5->global;
          lVar14 = 0;
          lVar15 = 2;
          my_size = 0;
          do {
            if (((-1 < pRVar6[lVar14]) && (pRVar5->ref_mpi->id == pRVar5->part[lVar14])) &&
               (ref_interp->cell[lVar14] == -1)) {
              *(int *)((long)pvVar11 + (long)my_size * 4) = (int)lVar14;
              pRVar7 = pRVar5->real;
              lVar17 = (long)(my_size * 3);
              *(REF_DBL *)((long)my_array + lVar17 * 8) = pRVar7[lVar15 + -2];
              *(REF_DBL *)((long)my_array + lVar17 * 8 + 8) = pRVar7[lVar15 + -1];
              *(REF_DBL *)((long)my_array + lVar17 * 8 + 0x10) = pRVar7[lVar15];
              my_size = my_size + 1;
            }
            lVar14 = lVar14 + 1;
            lVar15 = lVar15 + 0xf;
          } while (lVar14 < pRVar5->max);
        }
        local_108 = pvVar11;
        local_d8 = my_array;
        uVar8 = ref_mpi_allconcat(local_188,3,my_size,my_array,&total_node,&source,&global_xyz,3);
        if (uVar8 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x575,"ref_interp_nearest_tet_via_tri_in_tree",(ulong)uVar8,"cat");
          return uVar8;
        }
        if (source != (REF_INT *)0x0) {
          free(source);
        }
        uVar8 = ref_mpi_allconcat(local_188,1,my_size,local_108,&total_node,&source,&global_node,1);
        if (uVar8 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x579,"ref_interp_nearest_tet_via_tri_in_tree",(ulong)uVar8,"cat");
          return uVar8;
        }
        lVar14 = (long)total_node;
        if (lVar14 < 0) {
          pcVar19 = "malloc best_bary of REF_DBL negative";
          uVar16 = 0x57b;
          goto LAB_001a2628;
        }
        pdVar12 = (double *)malloc(lVar14 * 8);
        if (pdVar12 == (double *)0x0) {
          pcVar19 = "malloc best_bary of REF_DBL NULL";
          uVar16 = 0x57b;
        }
        else {
          sVar20 = lVar14 << 2;
          local_118 = malloc(sVar20);
          if (local_118 == (void *)0x0) {
            pcVar19 = "malloc best_node of REF_INT NULL";
            uVar16 = 0x57c;
          }
          else {
            pRVar13 = (REF_INT *)malloc(sVar20);
            if (pRVar13 == (REF_INT *)0x0) {
              pcVar19 = "malloc best_cell of REF_INT NULL";
              uVar16 = 0x57d;
            }
            else {
              local_120 = pRVar13;
              pRVar13 = (REF_INT *)malloc(sVar20);
              if (pRVar13 == (REF_INT *)0x0) {
                pcVar19 = "malloc from_proc of REF_INT NULL";
                uVar16 = 0x57e;
              }
              else {
                local_168 = pRVar13;
                local_128 = pdVar12;
                if (0 < total_node) {
                  uVar18 = 0;
                  lVar14 = 0;
                  pRVar13 = local_120;
                  do {
                    *(REF_INT *)((long)local_118 + lVar14 * 4) = global_node[lVar14];
                    *pRVar13 = -1;
                    *pdVar12 = 1e+20;
                    local_190 = uVar18;
                    local_178 = pdVar12;
                    uVar8 = ref_search_nearest_candidates
                                      (ref_search,ref_list,(REF_DBL *)((long)global_xyz + uVar18));
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0x585,"ref_interp_nearest_tet_via_tri_in_tree",(ulong)uVar8,
                             "near candidates");
                      return uVar8;
                    }
                    if (ref_list->n < 1) {
                      *pRVar13 = -1;
                    }
                    else {
                      uVar8 = ref_interp_best_tri_in_list
                                        (ref_interp,ref_list,
                                         (REF_DBL *)((long)global_xyz + local_190),pRVar13,bary);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,0x58a,"ref_interp_nearest_tet_via_tri_in_tree",(ulong)uVar8,
                               "best in list");
                        return uVar8;
                      }
                      if (*pRVar13 != -1) {
                        dVar21 = bary[0];
                        if (bary[1] <= bary[0]) {
                          dVar21 = bary[1];
                        }
                        RVar22 = bary[2];
                        if (bary[3] <= bary[2]) {
                          RVar22 = bary[3];
                        }
                        if (RVar22 <= dVar21) {
                          dVar21 = RVar22;
                        }
                        *local_178 = -dVar21;
                      }
                    }
                    ref_interp->tree_cells = ref_interp->tree_cells + ref_list->n;
                    uVar8 = ref_list_erase(ref_list);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0x593,"ref_interp_nearest_tet_via_tri_in_tree",(ulong)uVar8,
                             "reset list");
                      return uVar8;
                    }
                    lVar14 = lVar14 + 1;
                    uVar18 = local_190 + 0x18;
                    pdVar12 = local_178 + 1;
                    pRVar13 = pRVar13 + 1;
                  } while (lVar14 < total_node);
                }
                uVar8 = ref_mpi_allminwho(local_188,local_128,local_168,total_node);
                if (uVar8 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x597,"ref_interp_nearest_tet_via_tri_in_tree",(ulong)uVar8,"who");
                  return uVar8;
                }
                if ((long)total_node < 1) {
                  uVar8 = 0;
                }
                else {
                  lVar14 = 0;
                  uVar8 = 0;
                  do {
                    uVar8 = uVar8 + (local_188->id == local_168[lVar14]);
                    lVar14 = lVar14 + 1;
                  } while (total_node != lVar14);
                }
                if ((int)uVar8 < 0) {
                  pcVar19 = "malloc send_bary of REF_DBL negative";
                  uVar16 = 0x59d;
                  goto LAB_001a2628;
                }
                local_178 = (double *)malloc((ulong)(uVar8 * 4) << 3);
                if (local_178 == (double *)0x0) {
                  pcVar19 = "malloc send_bary of REF_DBL NULL";
                  uVar16 = 0x59d;
                }
                else {
                  sVar20 = (ulong)uVar8 * 4;
                  local_130 = malloc(sVar20);
                  if (local_130 == (void *)0x0) {
                    pcVar19 = "malloc send_cell of REF_INT NULL";
                    uVar16 = 0x59e;
                  }
                  else {
                    local_138 = malloc(sVar20);
                    if (local_138 == (void *)0x0) {
                      pcVar19 = "malloc send_node of REF_INT NULL";
                      uVar16 = 0x59f;
                    }
                    else {
                      local_180 = (REF_INT *)malloc(sVar20);
                      if (local_180 != (REF_INT *)0x0) {
                        pvVar11 = malloc(sVar20);
                        if (pvVar11 == (void *)0x0) {
                          local_170 = (void *)0x0;
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x5a1,"ref_interp_nearest_tet_via_tri_in_tree",
                                 "malloc my_proc of REF_INT NULL");
                          local_1a0 = 2;
                        }
                        else {
                          local_1a0 = 0;
                          local_170 = pvVar11;
                          if (uVar8 != 0) {
                            uVar18 = 0;
                            do {
                              *(REF_INT *)((long)pvVar11 + uVar18 * 4) = local_188->id;
                              uVar18 = uVar18 + 1;
                            } while (uVar8 != uVar18);
                          }
                        }
                        if (pvVar11 == (void *)0x0) {
                          return local_1a0;
                        }
                        if (total_node < 1) {
                          local_190 = 0;
                        }
                        else {
                          lVar15 = 0;
                          lVar14 = 0;
                          local_190 = 0;
                          pRVar13 = local_168;
                          do {
                            if (local_188->id == pRVar13[lVar14]) {
                              lVar17 = (long)(int)local_190;
                              local_180[lVar17] = source[lVar14];
                              uVar8 = *(uint *)((long)local_118 + lVar14 * 4);
                              *(uint *)((long)local_138 + lVar17 * 4) = uVar8;
                              cell = local_120[lVar14];
                              *(uint *)((long)local_130 + lVar17 * 4) = cell;
                              if (cell != 0xffffffff) {
                                uVar10 = ref_cell_nodes(local_158,cell,nodes);
                                if (uVar10 != 0) {
                                  local_10c = uVar10;
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                         ,0x5ad,"ref_interp_nearest_tet_via_tri_in_tree",
                                         (ulong)uVar10,"tet should be set and valid via tri search")
                                  ;
                                  printf("global %d best cell %d best bary %e\n",local_128[lVar14],
                                         (ulong)uVar8,(ulong)cell);
                                  local_1a0 = local_10c;
                                  uVar10 = local_10c;
                                }
                                if (uVar10 != 0) {
                                  return local_1a0;
                                }
                                uVar8 = ref_node_bary4(local_d0,nodes,
                                                       (REF_DBL *)((long)global_xyz + lVar15),
                                                       local_178 + (int)local_190 * 4);
                                if (uVar8 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                         ,0x5b0,"ref_interp_nearest_tet_via_tri_in_tree",
                                         (ulong)uVar8,"bary");
                                  return uVar8;
                                }
                              }
                              local_1a0 = 0;
                              local_190 = (ulong)((int)local_190 + 1);
                              pRVar13 = local_168;
                            }
                            lVar14 = lVar14 + 1;
                            lVar15 = lVar15 + 0x18;
                          } while (lVar14 < total_node);
                        }
                        uVar8 = ref_mpi_blindsend(local_188,local_180,local_138,1,(REF_INT)local_190
                                                  ,&recv_node,&nrecv,1);
                        if (uVar8 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x5b7,"ref_interp_nearest_tet_via_tri_in_tree",(ulong)uVar8,
                                 "blind send node");
                          return uVar8;
                        }
                        uVar8 = ref_mpi_blindsend(local_188,local_180,local_130,1,(REF_INT)local_190
                                                  ,&recv_cell,&nrecv,1);
                        if (uVar8 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x5ba,"ref_interp_nearest_tet_via_tri_in_tree",(ulong)uVar8,
                                 "blind send cell");
                          return uVar8;
                        }
                        uVar8 = ref_mpi_blindsend(local_188,local_180,local_170,1,(REF_INT)local_190
                                                  ,&recv_proc,&nrecv,1);
                        if (uVar8 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x5bd,"ref_interp_nearest_tet_via_tri_in_tree",(ulong)uVar8,
                                 "blind send proc");
                          return uVar8;
                        }
                        uVar8 = ref_mpi_blindsend(local_188,local_180,local_178,4,(REF_INT)local_190
                                                  ,&recv_bary,&nrecv,3);
                        if (uVar8 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x5c0,"ref_interp_nearest_tet_via_tri_in_tree",(ulong)uVar8,
                                 "blind send bary");
                          return uVar8;
                        }
                        if (0 < nrecv) {
                          local_158 = (REF_CELL)0x0;
                          lVar14 = 0;
                          do {
                            ref_interp->n_tree = ref_interp->n_tree + 1;
                            node = recv_node[lVar14];
                            iVar1 = ref_interp->cell[node];
                            if ((long)iVar1 != -1) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                     ,0x5c5,"ref_interp_nearest_tet_via_tri_in_tree",
                                     "tree already found?",0xffffffffffffffff,(long)iVar1);
                              local_1a0 = 1;
                            }
                            if (iVar1 != -1) {
                              return local_1a0;
                            }
                            if (ref_interp->agent_hired[node] != 0) {
                              uVar8 = ref_agents_delete(ref_interp->ref_agents,node);
                              if (uVar8 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                       ,0x5c7,"ref_interp_nearest_tet_via_tri_in_tree",(ulong)uVar8,
                                       "deq");
                                return uVar8;
                              }
                              ref_interp->agent_hired[node] = 0;
                            }
                            ref_interp->cell[node] = recv_cell[lVar14];
                            ref_interp->part[node] = recv_proc[lVar14];
                            if (recv_cell[lVar14] == -1) {
                              ref_interp->n_tree = ref_interp->n_tree + -1;
                            }
                            else {
                              pRVar7 = ref_interp->bary;
                              lVar15 = 0;
                              do {
                                pRVar7[(node << 2) + lVar15] =
                                     *(REF_DBL *)((long)recv_bary + lVar15 * 8 + (long)local_158);
                                lVar15 = lVar15 + 1;
                              } while (lVar15 != 4);
                            }
                            lVar14 = lVar14 + 1;
                            local_158 = (REF_CELL)((long)local_158 + 0x20);
                          } while (lVar14 < nrecv);
                        }
                        uVar8 = ref_mpi_allsum(local_188,&ref_interp->n_tree,1,1);
                        if (uVar8 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x5d4,"ref_interp_nearest_tet_via_tri_in_tree",(ulong)uVar8,"as");
                          return uVar8;
                        }
                        if (recv_node != (REF_INT *)0x0) {
                          free(recv_node);
                        }
                        if (recv_cell != (REF_INT *)0x0) {
                          free(recv_cell);
                        }
                        if (recv_proc != (REF_INT *)0x0) {
                          free(recv_proc);
                        }
                        if (recv_bary != (REF_DBL *)0x0) {
                          free(recv_bary);
                        }
                        free(local_178);
                        if (local_170 != (void *)0x0) {
                          free(local_170);
                        }
                        free(local_130);
                        free(local_138);
                        free(local_180);
                        free(local_168);
                        free(local_120);
                        free(local_118);
                        free(local_128);
                        if (source != (REF_INT *)0x0) {
                          free(source);
                        }
                        if (global_node != (REF_INT *)0x0) {
                          free(global_node);
                        }
                        if (global_xyz != (REF_DBL *)0x0) {
                          free(global_xyz);
                        }
                        free(local_d8);
                        free(local_108);
                        uVar8 = ref_list_free(ref_list);
                        if (uVar8 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x5ec,"ref_interp_nearest_tet_via_tri_in_tree",(ulong)uVar8,
                                 "free list");
                          return uVar8;
                        }
                        if ((long)pRVar5->max < 1) {
                          return 0;
                        }
                        lVar14 = 0;
                        while (((pRVar5->global[lVar14] < 0 ||
                                (pRVar5->ref_mpi->id != pRVar5->part[lVar14])) ||
                               (ref_interp->cell[lVar14] != -1))) {
                          lVar14 = lVar14 + 1;
                          if (pRVar5->max == lVar14) {
                            return 0;
                          }
                        }
                        pcVar19 = "node missed by tree";
                        uVar16 = 0x5f0;
                        goto LAB_001a2628;
                      }
                      pcVar19 = "malloc send_proc of REF_INT NULL";
                      uVar16 = 0x5a0;
                      local_180 = (REF_INT *)0x0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar16
           ,"ref_interp_nearest_tet_via_tri_in_tree",pcVar19);
    RVar9 = 2;
  }
  return RVar9;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_nearest_tet_via_tri_in_tree(
    REF_INTERP ref_interp, REF_SEARCH ref_search) {
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_CELL from_tet = ref_interp_from_tet(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_DBL bary[4];
  REF_LIST ref_list;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node, *best_node, *best_cell, *from_proc;
  REF_DBL *best_bary;
  REF_INT ntarget;
  REF_DBL *local_xyz, *global_xyz;
  REF_INT *local_node, *global_node;
  REF_INT *source, total_node;
  REF_INT nsend, nrecv;
  REF_INT *send_proc, *my_proc, *recv_proc;
  REF_INT *send_cell, *recv_cell;
  REF_INT *send_node, *recv_node;
  REF_DBL *send_bary, *recv_bary;
  REF_INT i, item;

  RSS(ref_list_create(&ref_list), "create list");

  ntarget = 0;
  each_ref_node_valid_node(to_node, node) {
    if (!ref_node_owned(to_node, node) || REF_EMPTY != ref_interp->cell[node])
      continue;
    ntarget++;
  }
  ref_malloc(local_node, ntarget, REF_INT);
  ref_malloc(local_xyz, 3 * ntarget, REF_DBL);
  ntarget = 0;
  each_ref_node_valid_node(to_node, node) {
    if (!ref_node_owned(to_node, node) || REF_EMPTY != ref_interp->cell[node])
      continue;
    local_node[ntarget] = node;
    local_xyz[0 + 3 * ntarget] = ref_node_xyz(to_node, 0, node);
    local_xyz[1 + 3 * ntarget] = ref_node_xyz(to_node, 1, node);
    local_xyz[2 + 3 * ntarget] = ref_node_xyz(to_node, 2, node);
    ntarget++;
  }
  RSS(ref_mpi_allconcat(ref_mpi, 3, ntarget, (void *)local_xyz, &total_node,
                        &source, (void **)&global_xyz, REF_DBL_TYPE),
      "cat");
  ref_free(source);
  RSS(ref_mpi_allconcat(ref_mpi, 1, ntarget, (void *)local_node, &total_node,
                        &source, (void **)&global_node, REF_INT_TYPE),
      "cat");

  ref_malloc(best_bary, total_node, REF_DBL);
  ref_malloc(best_node, total_node, REF_INT);
  ref_malloc(best_cell, total_node, REF_INT);
  ref_malloc(from_proc, total_node, REF_INT);
  for (node = 0; node < total_node; node++) {
    best_node[node] = global_node[node];
    best_cell[node] = REF_EMPTY;
    best_bary[node] = 1.0e20; /* negative for min, until use allmaxwho */
    RSS(ref_search_nearest_candidates(ref_search, ref_list,
                                      &(global_xyz[3 * node])),
        "near candidates");
    if (ref_list_n(ref_list) > 0) {
      RSS(ref_interp_best_tri_in_list(ref_interp, ref_list,
                                      &(global_xyz[3 * node]),
                                      &(best_cell[node]), bary),
          "best in list");
      if (REF_EMPTY != best_cell[node]) {
        /* negative for min, until use allmaxwho */
        best_bary[node] = -MIN(MIN(bary[0], bary[1]), MIN(bary[2], bary[3]));
      }
    } else {
      best_cell[node] = REF_EMPTY;
    }
    (ref_interp->tree_cells) += ref_list_n(ref_list);
    RSS(ref_list_erase(ref_list), "reset list");
  }

  /* negative for min, until use max*/
  RSS(ref_mpi_allminwho(ref_mpi, best_bary, from_proc, total_node), "who");

  nsend = 0;
  for (node = 0; node < total_node; node++)
    if (ref_mpi_rank(ref_mpi) == from_proc[node]) nsend++;

  ref_malloc(send_bary, 4 * nsend, REF_DBL);
  ref_malloc(send_cell, nsend, REF_INT);
  ref_malloc(send_node, nsend, REF_INT);
  ref_malloc(send_proc, nsend, REF_INT);
  ref_malloc_init(my_proc, nsend, REF_INT, ref_mpi_rank(ref_mpi));
  nsend = 0;
  for (node = 0; node < total_node; node++)
    if (ref_mpi_rank(ref_mpi) == from_proc[node]) {
      send_proc[nsend] = source[node];
      send_node[nsend] = best_node[node];
      send_cell[nsend] = best_cell[node];
      if (REF_EMPTY != send_cell[nsend]) {
        RSB(ref_cell_nodes(from_tet, best_cell[node], nodes),
            "tet should be set and valid via tri search", {
              printf("global %d best cell %d best bary %e\n", best_node[node],
                     best_cell[node], best_bary[node]);
            });
        RSS(ref_node_bary4(from_node, nodes, &(global_xyz[3 * node]),
                           &(send_bary[4 * nsend])),
            "bary");
      }
      nsend++;
    }

  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_node, 1, nsend,
                        (void **)(&recv_node), &nrecv, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_cell, 1, nsend,
                        (void **)(&recv_cell), &nrecv, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)my_proc, 1, nsend,
                        (void **)(&recv_proc), &nrecv, REF_INT_TYPE),
      "blind send proc");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_bary, 4, nsend,
                        (void **)(&recv_bary), &nrecv, REF_DBL_TYPE),
      "blind send bary");

  for (item = 0; item < nrecv; item++) {
    (ref_interp->n_tree)++;
    node = recv_node[item];
    REIS(REF_EMPTY, ref_interp->cell[node], "tree already found?");
    if (ref_interp->agent_hired[node]) { /* need to dequeue */
      RSS(ref_agents_delete(ref_interp->ref_agents, node), "deq");
      ref_interp->agent_hired[node] = REF_FALSE;
    }
    ref_interp->cell[node] = recv_cell[item];
    ref_interp->part[node] = recv_proc[item];
    if (REF_EMPTY != recv_cell[item]) {
      for (i = 0; i < 4; i++)
        ref_interp->bary[i + 4 * node] = recv_bary[i + 4 * item];
    } else {
      (ref_interp->n_tree)--;
    }
  }

  RSS(ref_mpi_allsum(ref_mpi, &(ref_interp->n_tree), 1, REF_INT_TYPE), "as");

  ref_free(recv_node);
  ref_free(recv_cell);
  ref_free(recv_proc);
  ref_free(recv_bary);

  ref_free(send_bary);
  ref_free(my_proc);
  ref_free(send_cell);
  ref_free(send_node);
  ref_free(send_proc);

  ref_free(from_proc);
  ref_free(best_cell);
  ref_free(best_node);
  ref_free(best_bary);

  ref_free(source);
  ref_free(global_node);
  ref_free(global_xyz);
  ref_free(local_xyz);
  ref_free(local_node);

  RSS(ref_list_free(ref_list), "free list");

  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node)) {
      RUS(REF_EMPTY, ref_interp->cell[node], "node missed by tree");
    }
  }

  return REF_SUCCESS;
}